

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O0

int Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>::half_cycles_per_line
              (void)

{
  return 0x1bf;
}

Assistant:

static constexpr int half_cycles_per_line() {
			if constexpr (timing == Timing::FortyEightK) {
				// TODO: determine real figure here, if one exists.
				// The source I'm looking at now suggests that the theoretical
				// ideal of 224*2 ignores the real-life effects of separate
				// crystals, so I've nudged this experimentally.
				return 224*2 - 1;
			} else {
				return 227*2;
			}
		}